

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distribution.cpp
# Opt level: O3

void __thiscall Distribution::Distribution(Distribution *this)

{
  uint uVar1;
  long lVar2;
  size_t __i;
  ulong uVar3;
  random_device rd;
  random_device rStack_2728;
  ulong local_13a0 [624];
  undefined8 local_20;
  
  this->_vptr_Distribution = (_func_int **)&PTR___cxa_pure_virtual_0010bd00;
  std::random_device::random_device(&this->rd);
  *(undefined4 *)&(this->distrib)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->distrib)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_b + 4) = 0x3ff00000;
  (this->gen)._M_x[0] = 0x1571;
  uVar3 = 0x1571;
  lVar2 = 0;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2 + 1);
    (this->gen)._M_x[lVar2 + 1] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x26f);
  (this->gen)._M_p = 0x270;
  std::random_device::random_device(&rStack_2728);
  uVar1 = std::random_device::_M_getval();
  local_13a0[0] = (ulong)uVar1;
  lVar2 = 1;
  uVar3 = local_13a0[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13a0[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_20 = 0x270;
  memcpy(&this->gen,local_13a0,5000);
  *(undefined4 *)&(this->distrib)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->distrib)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->distrib)._M_param._M_b + 4) = 0x3ff00000;
  std::random_device::_M_fini();
  return;
}

Assistant:

Distribution::Distribution() {
	std::random_device rd;		//Will be used to obtain a seed for the random number engine
	gen = std::mt19937 (rd());	//Standard mersenne_twister_engine seeded with rd()
	distrib = std::uniform_real_distribution<> (0,1);
}